

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::GatherBase::VerifyCompute(GatherBase *this)

{
  bool bVar1;
  TGBase *this_00;
  Vec4 *epsilon;
  long lVar2;
  Vec4 local_60;
  undefined1 local_50 [12];
  float local_44;
  undefined1 local_40 [8];
  float local_38;
  undefined1 local_30 [4];
  float local_2c;
  
  lVar2 = 0;
  epsilon = (Vec4 *)0x10;
  this_00 = (TGBase *)
            glu::CallLogWrapper::glMapBufferRange
                      (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                       0x90d2,0,0x10,1);
  (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x20])(&local_60,this);
  bVar1 = TGBase::ColorEqual(this_00,&local_60,&(this->super_TGBase).g_color_eps,epsilon);
  if (!bVar1) {
    (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x20])(&local_60,this);
    (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x20])(local_30,this);
    (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x20])(local_40,this);
    (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x20])(local_50,this);
    anon_unknown_0::Output
              ("Expected %f, %f, %f, %f, got: %f, %f, %f, %f, epsilon: %f, %f, %f, %f",
               (double)local_60.m_data[0],(double)local_2c,(double)local_38,(double)local_44,
               (double)*(float *)&(this_00->super_SubcaseBase).super_GLWrapper._vptr_GLWrapper,
               (double)*(float *)((long)&(this_00->super_SubcaseBase).super_GLWrapper.
                                         _vptr_GLWrapper + 4),
               (double)*(float *)&(this_00->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper.
                                  m_gl,
               (double)*(float *)((long)&(this_00->super_SubcaseBase).super_GLWrapper.
                                         super_CallLogWrapper.m_gl + 4));
    lVar2 = -1;
  }
  return lVar2;
}

Assistant:

virtual long VerifyCompute()
	{
		Vec4* data;
		data = static_cast<Vec4*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(Vec4), GL_MAP_READ_BIT));
		if (!ColorEqual(data[0], Expected(), g_color_eps))
		{ // for unorms
			Output("Expected %f, %f, %f, %f, got: %f, %f, %f, %f, epsilon: %f, %f, %f, %f", Expected().x(),
				   Expected().y(), Expected().z(), Expected().w(), data[0].x(), data[0].y(), data[0].z(), data[0].w());
			return ERROR;
		}
		return NO_ERROR;
	}